

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_context_pool.hpp
# Opt level: O2

io_context_pool * coro_io::g_io_context_pool<coro_io::io_context_pool>(uint pool_size)

{
  bool bVar1;
  int iVar2;
  _lambda_auto_1__1_ local_2d [5];
  __shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  if (g_io_context_pool<coro_io::io_context_pool>(unsigned_int)::_g_io_context_pool == '\0') {
    iVar2 = __cxa_guard_acquire(&g_io_context_pool<coro_io::io_context_pool>(unsigned_int)::
                                 _g_io_context_pool);
    if (iVar2 != 0) {
      std::make_shared<coro_io::io_context_pool,unsigned_int&>
                ((uint *)&g_io_context_pool<coro_io::io_context_pool>::_g_io_context_pool);
      __cxa_atexit(std::__shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&g_io_context_pool<coro_io::io_context_pool>::_g_io_context_pool,
                   &__dso_handle);
      __cxa_guard_release(&g_io_context_pool<coro_io::io_context_pool>(unsigned_int)::
                           _g_io_context_pool);
    }
  }
  if (g_io_context_pool<coro_io::io_context_pool>(unsigned_int)::run_helper == '\0') {
    iVar2 = __cxa_guard_acquire(&g_io_context_pool<coro_io::io_context_pool>(unsigned_int)::
                                 run_helper);
    if (iVar2 != 0) {
      std::__shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_28,
                 &g_io_context_pool<coro_io::io_context_pool>::_g_io_context_pool.
                  super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>);
      bVar1 = g_io_context_pool<coro_io::io_context_pool>(unsigned_int)::{lambda(auto:1)#1}::
              operator()(local_2d,(shared_ptr<coro_io::io_context_pool> *)&local_28);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
      g_io_context_pool<coro_io::io_context_pool>::run_helper = bVar1;
      __cxa_guard_release(&g_io_context_pool<coro_io::io_context_pool>(unsigned_int)::run_helper);
    }
  }
  return g_io_context_pool<coro_io::io_context_pool>::_g_io_context_pool.
         super___shared_ptr<coro_io::io_context_pool,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
}

Assistant:

inline T &g_io_context_pool(
    unsigned pool_size = std::thread::hardware_concurrency()) {
  static auto _g_io_context_pool = std::make_shared<T>(pool_size);
  [[maybe_unused]] static bool run_helper = [](auto pool) {
    std::thread thrd{[pool] {
      pool->run();
    }};
    thrd.detach();
    return true;
  }(_g_io_context_pool);
  return *_g_io_context_pool;
}